

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

void tidyDocRelease(TidyDocImpl *doc)

{
  TidyDocImpl *doc_local;
  
  if (doc != (TidyDocImpl *)0x0) {
    if (doc->docIn != (StreamIn *)0x0) {
      __assert_fail("doc->docIn == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/tidylib.c"
                    ,0x98,"void tidyDocRelease(TidyDocImpl *)");
    }
    if (doc->docOut != (StreamOut *)0x0) {
      __assert_fail("doc->docOut == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/tidylib.c"
                    ,0x99,"void tidyDocRelease(TidyDocImpl *)");
    }
    prvTidyReleaseStreamOut(doc,doc->errout);
    doc->errout = (StreamOut *)0x0;
    prvTidyFreePrintBuf(doc);
    prvTidyFreeNode(doc,&doc->root);
    memset(doc,0,0x68);
    if (doc->givenDoctype != (tmbstr)0x0) {
      (*doc->allocator->vtbl->free)(doc->allocator,doc->givenDoctype);
    }
    prvTidyFreeConfig(doc);
    prvTidyFreeAttrTable(doc);
    prvTidyFreeAttrPriorityList(doc);
    prvTidyFreeMutedMessageList(doc);
    prvTidyFreeTags(doc);
    prvTidyFreeLexer(doc);
    (*doc->allocator->vtbl->free)(doc->allocator,doc);
  }
  return;
}

Assistant:

void          tidyDocRelease( TidyDocImpl* doc )
{
    /* doc in/out opened and closed by parse/print routines */
    if ( doc )
    {
        assert( doc->docIn == NULL );
        assert( doc->docOut == NULL );

        TY_(ReleaseStreamOut)( doc, doc->errout );
        doc->errout = NULL;

        TY_(FreePrintBuf)( doc );
        TY_(FreeNode)(doc, &doc->root);
        TidyClearMemory(&doc->root, sizeof(Node));

        if (doc->givenDoctype)
            TidyDocFree(doc, doc->givenDoctype);

        TY_(FreeConfig)( doc );
        TY_(FreeAttrTable)( doc );
        TY_(FreeAttrPriorityList)( doc );
        TY_(FreeMutedMessageList( doc ));
        TY_(FreeTags)( doc );
        /*\ 
         *  Issue #186 - Now FreeNode depend on the doctype, so the lexer is needed
         *  to determine which hash is to be used, so free it last.
        \*/
        TY_(FreeLexer)( doc );
        TidyDocFree( doc, doc );
    }
}